

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

void __thiscall
jsonnet::internal::Unparser::unparseParams
          (Unparser *this,Fodder *fodder_l,ArgParams *params,bool trailing_comma,Fodder *fodder_r)

{
  pointer pAVar1;
  ostream *poVar2;
  bool bVar3;
  Fodder *fodder;
  string local_50;
  
  fill(this,fodder_l,false,false);
  std::operator<<(this->o,"(");
  pAVar1 = (params->
           super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar3 = true;
  for (fodder = &((params->
                  super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                  )._M_impl.super__Vector_impl_data._M_start)->commaFodder;
      (pointer)((long)(fodder + -3) + 8) != pAVar1; fodder = (Fodder *)((long)(fodder + 3) + 0x10))
  {
    if (!bVar3) {
      std::operator<<(this->o,",");
    }
    fill(this,(Fodder *)((long)(fodder + -3) + 8),(bool)(~bVar3 & 1),true);
    poVar2 = this->o;
    encode_utf8(&local_50,*(UString **)((long)(fodder + -2) + 8));
    std::operator<<(poVar2,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (*(long *)((long)(fodder + -1) + 0x10) != 0) {
      fill(this,(Fodder *)((long)(fodder + -2) + 0x10),false,false);
      std::operator<<(this->o,"=");
      unparse(this,*(AST **)((long)(fodder + -1) + 0x10),false);
    }
    bVar3 = false;
    fill(this,fodder,false,false);
  }
  if (trailing_comma) {
    std::operator<<(this->o,",");
  }
  fill(this,fodder_r,false,false);
  std::operator<<(this->o,")");
  return;
}

Assistant:

void unparseParams(const Fodder &fodder_l, const ArgParams &params, bool trailing_comma,
                       const Fodder &fodder_r)
    {
        fill(fodder_l, false, false);
        o << "(";
        bool first = true;
        for (const auto &param : params) {
            if (!first)
                o << ",";
            fill(param.idFodder, !first, true);
            o << unparse_id(param.id);
            if (param.expr != nullptr) {
                // default arg, no spacing: x=e
                fill(param.eqFodder, false, false);
                o << "=";
                unparse(param.expr, false);
            }
            fill(param.commaFodder, false, false);
            first = false;
        }
        if (trailing_comma)
            o << ",";
        fill(fodder_r, false, false);
        o << ")";
    }